

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Gia_Man_t * Lf_ManDeriveMapping(Lf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Lf_Cut_t *pLVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  pJVar2 = p->pPars;
  if ((pJVar2->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6b2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  uVar3 = p->pGia->nObjs;
  iVar9 = (int)pJVar2->Edge + uVar3;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < (iVar9 + iVar1 * 2) - 1U) {
    iVar7 = iVar9 + iVar1 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar4;
  if (iVar7 < (int)uVar3) {
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar3 << 2);
    }
    p_00->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset(p_00->pArray,0,(ulong)uVar3 * 4);
  }
  p_00->nSize = uVar3;
  pGVar6 = p->pGia;
  if (0 < pGVar6->nObjs) {
    lVar10 = 0;
    do {
      uVar3 = (uint)*(undefined8 *)(pGVar6->pObjs + lVar10);
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if ((p->vOffsets).nSize <= lVar10) {
LAB_00762466:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vOffsets).pArray[lVar10];
        if (((long)iVar1 < 0) || ((p->vMapRefs).nSize <= iVar1)) goto LAB_00762466;
        if ((p->vMapRefs).pArray[iVar1] != 0) {
          if (((-1 < (int)uVar3) && ((uVar3 & 0x1fffffff) != 0x1fffffff)) &&
             ((uVar3 & 0x1fffffff) ==
              ((uint)((ulong)*(undefined8 *)(pGVar6->pObjs + lVar10) >> 0x20) & 0x1fffffff))) {
            __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                          ,0x6b9,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
          }
          pLVar5 = Lf_ObjCutBest(p,(int)lVar10);
          if ((pLVar5->field_0x16 & 0x80) != 0) {
            __assert_fail("!pCut->fMux7",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                          ,0x6bb,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
          }
          if (p_00->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p_00->pArray[lVar10] = p_00->nSize;
          Vec_IntPush(p_00,(uint)(byte)pLVar5->field_0x17);
          if (0xffffff < *(uint *)&pLVar5->field_0x14) {
            uVar8 = 0;
            do {
              Vec_IntPush(p_00,*(int *)((long)&pLVar5[1].Sign + uVar8 * 4));
              uVar8 = uVar8 + 1;
            } while (uVar8 < (byte)pLVar5->field_0x17);
          }
          Vec_IntPush(p_00,(int)lVar10);
        }
      }
      lVar10 = lVar10 + 1;
      pGVar6 = p->pGia;
    } while (lVar10 < pGVar6->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6c2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  pGVar6->vMapping = p_00;
  return pGVar6;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMapping( Lf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Lf_ObjCutBest( p, i );
        assert( !pCut->fMux7 );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( vMapping, pCut->pLeaves[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}